

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

word Dsd_TreeFunc2Truth_rec(DdManager *dd,DdNode *bFunc)

{
  int iVar1;
  word wVar2;
  word wVar3;
  int Level;
  word Cof1;
  word Cof0;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  if (bFunc == (DdNode *)((ulong)dd->one ^ 1)) {
    dd_local = (DdManager *)0x0;
  }
  else if (bFunc == dd->one) {
    dd_local = (DdManager *)0xffffffffffffffff;
  }
  else if (((ulong)bFunc & 1) == 0) {
    iVar1 = dd->perm[bFunc->index];
    if ((iVar1 < 0) || (5 < iVar1)) {
      __assert_fail("Level >= 0 && Level < 6",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdTree.c"
                    ,0x350,"word Dsd_TreeFunc2Truth_rec(DdManager *, DdNode *)");
    }
    wVar2 = Dsd_TreeFunc2Truth_rec(dd,(bFunc->type).kids.E);
    wVar3 = Dsd_TreeFunc2Truth_rec(dd,(bFunc->type).kids.T);
    dd_local = (DdManager *)
               (s_Truths6[iVar1] & wVar3 | (s_Truths6[iVar1] ^ 0xffffffffffffffff) & wVar2);
  }
  else {
    wVar2 = Dsd_TreeFunc2Truth_rec(dd,(DdNode *)((ulong)bFunc ^ 1));
    dd_local = (DdManager *)(wVar2 ^ 0xffffffffffffffff);
  }
  return (word)dd_local;
}

Assistant:

word Dsd_TreeFunc2Truth_rec( DdManager * dd, DdNode * bFunc )
{
    word Cof0, Cof1;
    int Level;
    if ( bFunc == b0 )
        return 0;
    if ( bFunc == b1 )
        return ~(word)0;
    if ( Cudd_IsComplement(bFunc) )
        return ~Dsd_TreeFunc2Truth_rec( dd, Cudd_Not(bFunc) );
    Level = dd->perm[bFunc->index];
    assert( Level >= 0 && Level < 6 );
    Cof0 = Dsd_TreeFunc2Truth_rec( dd, cuddE(bFunc) );
    Cof1 = Dsd_TreeFunc2Truth_rec( dd, cuddT(bFunc) );
    return (s_Truths6[Level] & Cof1) | (~s_Truths6[Level] & Cof0);
}